

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

void __thiscall
Js::JavascriptStackWalker::SetCachedInternalFrameInfo
          (JavascriptStackWalker *this,InternalFrameType frameType,JavascriptFunction *function,
          bool hasInlinedFramesOnStack,bool previousInterpreterFrameIsFromBailout)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  
  if ((this->lastInternalFrameInfo).codeAddress == (void *)0x0) {
    sVar3 = (this->currentFrame).stackCheckCodeHeight;
    uVar1 = (this->currentFrame).frame;
    uVar2 = (this->currentFrame).codeAddr;
    auVar4._8_4_ = (int)uVar1;
    auVar4._0_8_ = uVar2;
    auVar4._12_4_ = (int)((ulong)uVar1 >> 0x20);
    (this->lastInternalFrameInfo).codeAddress = (void *)uVar2;
    (this->lastInternalFrameInfo).framePointer = (void *)auVar4._8_8_;
    (this->lastInternalFrameInfo).stackCheckCodeHeight = sVar3;
    (this->lastInternalFrameInfo).frameType = frameType;
    (this->lastInternalFrameInfo).function = function;
    (this->lastInternalFrameInfo).hasInlinedFramesOnStack = hasInlinedFramesOnStack;
    (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout =
         previousInterpreterFrameIsFromBailout;
  }
  return;
}

Assistant:

void JavascriptStackWalker::SetCachedInternalFrameInfo(InternalFrameType frameType, JavascriptFunction* function, bool hasInlinedFramesOnStack, bool previousInterpreterFrameIsFromBailout)
    {
        if (!this->lastInternalFrameInfo.codeAddress)
        {
            this->lastInternalFrameInfo.Set(
                this->GetCurrentCodeAddr(),
                this->currentFrame.GetFrame(),
                this->currentFrame.GetStackCheckCodeHeight(),
                frameType,
                function,
                hasInlinedFramesOnStack,
                previousInterpreterFrameIsFromBailout);
        }
    }